

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::SymbolMatcher::SymbolMatcher
          (SymbolMatcher *this,UnicodeString *symbolString,Key key)

{
  UBool UVar1;
  UnicodeSet *this_00;
  
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003e8f18;
  (this->fString).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (this->fString).fUnion.fStackFields.fLengthAndFlags = 2;
  this_00 = unisets::get(key);
  this->fUniSet = this_00;
  UVar1 = UnicodeSet::contains(this_00,symbolString);
  if (UVar1 == '\0') {
    UnicodeString::operator=(&this->fString,symbolString);
  }
  else {
    UnicodeString::setToBogus(&this->fString);
  }
  return;
}

Assistant:

SymbolMatcher::SymbolMatcher(const UnicodeString& symbolString, unisets::Key key) {
    fUniSet = unisets::get(key);
    if (fUniSet->contains(symbolString)) {
        fString.setToBogus();
    } else {
        fString = symbolString;
    }
}